

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.h
# Opt level: O2

string * __thiscall
google::protobuf::Join<google::protobuf::RepeatedField<int>>
          (string *__return_storage_ptr__,protobuf *this,RepeatedField<int> *components,char *delim)

{
  long lVar1;
  int *end;
  int *start;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar1 = *(long *)(this + 8);
  start = (int *)(lVar1 + 8);
  if (lVar1 == 0) {
    start = (int *)0x0;
  }
  end = (int *)(lVar1 + 8 + (long)*(int *)this * 4);
  if (lVar1 == 0) {
    end = (int *)0x0;
  }
  Join<int_const*>(start,end,(char *)components,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string Join(const Range& components,
            const char* delim) {
  string result;
  Join(components.begin(), components.end(), delim, &result);
  return result;
}